

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall
CTcMake::build_image_file
          (CTcMake *this,CTcHostIfc *hostifc,CResLoader *res_loader,char *image_fname,
          int *error_count,int *warning_count,CVmRuntimeSymbols *runtime_symtab,
          CVmRuntimeSymbols *runtime_macros,char *tool_data)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  FILE *fp_00;
  CVmFile *pCVar5;
  CTcMacroTable *pCVar6;
  char *in_RCX;
  EVP_PKEY_CTX *in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  char *report_fname;
  char obj_fname [4096];
  osfildef *objfp;
  CTcMakeModule *mod;
  err_frame_t err_cur__;
  CVmFile *objfile;
  CVmFile *fp;
  osfildef *fpout;
  _func_void_void_ptr_CTcSymbol_ptr *in_stack_ffffffffffffee68;
  CTcParser *in_stack_ffffffffffffee70;
  void *pvVar7;
  CTcMakeModule *in_stack_ffffffffffffee80;
  textchar_t *in_stack_ffffffffffffee88;
  CTcMake *in_stack_ffffffffffffee90;
  char local_1138 [96];
  CTcMake *in_stack_ffffffffffffefa0;
  char *in_stack_fffffffffffff048;
  uchar in_stack_fffffffffffff057;
  CVmFile *in_stack_fffffffffffff058;
  CTcGenTarg *in_stack_fffffffffffff060;
  textchar_t *in_stack_fffffffffffff078;
  CVmFile *in_stack_fffffffffffff080;
  CTcGenTarg *in_stack_fffffffffffff088;
  CTcMakeModule *local_130;
  uint local_128 [2];
  undefined8 local_120;
  void *local_118;
  __jmp_buf_tag _Stack_110;
  CVmFile *local_48;
  CVmFile *local_40;
  FILE *local_38;
  int *local_30;
  int *local_28;
  char *local_20;
  EVP_PKEY_CTX *local_10;
  
  local_40 = (CVmFile *)0x0;
  local_48 = (CVmFile *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  local_120 = *puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)local_128;
  local_128[0] = _setjmp(&_Stack_110);
  if (local_128[0] == 0) {
    CTcMain::init(local_10);
    set_compiler_options(in_stack_ffffffffffffefa0);
    for (local_130 = *(CTcMakeModule **)(in_RDI + 0x30); local_130 != (CTcMakeModule *)0x0;
        local_130 = CTcMakeModule::get_next(local_130)) {
      iVar2 = CTcMakeModule::is_excluded(local_130);
      if (iVar2 == 0) {
        get_objfile(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
        fp_00 = fopen(local_1138,"rb");
        if (fp_00 == (FILE *)0x0) {
          CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x296c,local_1138);
        }
        else {
          if (*(int *)(in_RDI + 0xd0) != 0) {
            os_get_root_name((char *)in_stack_ffffffffffffee70);
          }
          pCVar5 = (CVmFile *)operator_new(0x10);
          CVmFile::CVmFile(pCVar5);
          local_48 = pCVar5;
          CVmFile::set_file(pCVar5,(osfildef *)fp_00,0);
          CTcGenTarg::load_object_file
                    (in_stack_fffffffffffff088,in_stack_fffffffffffff080,in_stack_fffffffffffff078);
          pCVar5 = local_48;
          if (local_48 != (CVmFile *)0x0) {
            CVmFile::~CVmFile((CVmFile *)in_stack_ffffffffffffee70);
            operator_delete(pCVar5,0x10);
          }
          local_48 = (CVmFile *)0x0;
        }
      }
    }
    iVar2 = CTcMain::get_error_count(G_tcmain);
    if ((iVar2 == 0) &&
       (iVar2 = CTcParser::check_unresolved_externs(in_stack_ffffffffffffee70), iVar2 == 0)) {
      local_38 = fopen(local_20,"wb");
      if (local_38 == (FILE *)0x0) {
        CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x296a,local_20);
      }
      else {
        pCVar5 = (CVmFile *)operator_new(0x10);
        CVmFile::CVmFile(pCVar5);
        local_40 = pCVar5;
        CVmFile::set_file(pCVar5,(osfildef *)local_38,0);
        CTcGenTarg::write_to_image
                  (in_stack_fffffffffffff060,in_stack_fffffffffffff058,in_stack_fffffffffffff057,
                   in_stack_fffffffffffff048);
      }
    }
  }
  if ((local_128[0] & 0x8000) == 0) {
    local_128[0] = local_128[0] | 0x8000;
    iVar2 = CTcMain::get_error_count(G_tcmain);
    *local_28 = iVar2 + *local_28;
    iVar2 = CTcMain::get_warning_count(G_tcmain);
    *local_30 = iVar2 + *local_30;
    if (*local_28 == 0) {
      if (in_stack_00000008 != 0) {
        CTcParser::get_global_symtab(G_prs);
        CTcPrsSymtab::enum_entries
                  ((CTcPrsSymtab *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
                   (void *)0x20b673);
      }
      if (in_stack_00000010 != 0) {
        pCVar6 = CTcTokenizer::get_defines_table(G_tok);
        (*pCVar6->_vptr_CTcMacroTable[5])(pCVar6,build_runtime_macro_cb,in_stack_00000010);
      }
    }
    if (local_40 != (CVmFile *)0x0) {
      if (local_40 != (CVmFile *)0x0) {
        pCVar5 = local_40;
        CVmFile::~CVmFile((CVmFile *)in_stack_ffffffffffffee70);
        operator_delete(pCVar5,0x10);
      }
      local_40 = (CVmFile *)0x0;
    }
    if (local_48 != (CVmFile *)0x0) {
      if (local_48 != (CVmFile *)0x0) {
        pCVar5 = local_48;
        CVmFile::~CVmFile((CVmFile *)in_stack_ffffffffffffee70);
        operator_delete(pCVar5,0x10);
      }
      local_48 = (CVmFile *)0x0;
    }
    if ((*local_28 != 0) || ((*(int *)(in_RDI + 0x98) != 0 && (*local_30 != 0)))) {
      remove(local_20);
    }
    CTcMain::terminate();
  }
  uVar1 = local_120;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar1;
  if ((local_128[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pvVar7 = local_118;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar4 + 0x10) = pvVar7;
    err_rethrow();
  }
  if ((local_128[0] & 2) != 0) {
    free(local_118);
  }
  return;
}

Assistant:

void CTcMake::build_image_file(CTcHostIfc *hostifc,
                               CResLoader *res_loader,
                               const char *image_fname,
                               int *error_count, int *warning_count,
                               CVmRuntimeSymbols *runtime_symtab,
                               CVmRuntimeSymbols *runtime_macros,
                               const char tool_data[4])
{
    osfildef *fpout;
    CVmFile *volatile fp = 0;
    CVmFile *volatile objfile = 0;

    err_try
    {
        CTcMakeModule *mod;

        /* initialize the compiler */
        CTcMain::init(hostifc, res_loader, source_charset_);

        /* set options */
        set_compiler_options();

        /* load each object module */
        for (mod = mod_head_ ; mod != 0 ; mod = mod->get_next())
        {
            osfildef *objfp;
            char obj_fname[OSFNMAX];

            /* if this module is excluded, skip it */
            if (mod->is_excluded())
                continue;

            /* derive the object filename */
            get_objfile(obj_fname, mod);

            /* open the file */
            objfp = osfoprb(obj_fname, OSFTT3OBJ);
            if (objfp == 0)
            {
                /* log the error */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_MAKE_CANNOT_OPEN_OBJ, obj_fname);
            }
            else
            {
                const char *report_fname;

                /* 
                 *   if we're in test reporting mode, use the root name only
                 *   in error reports 
                 */
                if (test_report_mode_)
                    report_fname = os_get_root_name((char *)obj_fname);
                else
                    report_fname = obj_fname;
                
                /* set up the file object */
                objfile = new CVmFile();
                objfile->set_file(objfp, 0);

                /* load it */
                G_cg->load_object_file(objfile, report_fname);

                /* done with the file - close it */
                delete objfile;
                objfile = 0;
            }
        }

        /* if we encountered errors loading object files, give up */
        if (G_tcmain->get_error_count() != 0)
            goto done;

        /* check for unresolved externals */
        if (G_prs->check_unresolved_externs())
            goto done;

        /* set up the output file */
        fpout = osfopwb(image_fname, OSFTT3IMG);
        if (fpout == 0)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                TCERR_MAKE_CANNOT_CREATE_IMG, image_fname);
            goto done;
        }
        fp = new CVmFile();
        fp->set_file(fpout, 0);

        /* write the image file */
        G_cg->write_to_image(fp, data_xor_mask_, tool_data);

    done: ;
    }